

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btVectorX<float>::btVectorX(btVectorX<float> *this,int numRows)

{
  uint in_ESI;
  undefined8 in_RDI;
  int newsize;
  btAlignedObjectArray<float> *unaff_retaddr;
  btAlignedObjectArray<float> *in_stack_ffffffffffffffe0;
  
  newsize = (int)((ulong)in_RDI >> 0x20);
  btAlignedObjectArray<float>::btAlignedObjectArray(in_stack_ffffffffffffffe0);
  btAlignedObjectArray<float>::resize(unaff_retaddr,newsize,(float *)((ulong)in_ESI << 0x20));
  return;
}

Assistant:

btVectorX(int numRows)
	{
		m_storage.resize(numRows);
	}